

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
FlatSigningProvider::GetCScript(FlatSigningProvider *this,CScriptID *scriptid,CScript *script)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = LookupHelper<std::map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>,CScriptID,CScript>
                      (&this->scripts,scriptid,script);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetCScript(const CScriptID& scriptid, CScript& script) const { return LookupHelper(scripts, scriptid, script); }